

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathLastFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr value;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 0) {
      if (ctxt->valueNr < 0) {
        xmlXPathErr(ctxt,0x17);
      }
      else if (ctxt->context->contextSize < 0) {
        xmlXPathErr(ctxt,0xd);
      }
      else {
        value = xmlXPathCacheNewFloat(ctxt,(double)ctxt->context->contextSize);
        xmlXPathValuePush(ctxt,value);
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathLastFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(0);
    if (ctxt->context->contextSize >= 0) {
	xmlXPathValuePush(ctxt,
	    xmlXPathCacheNewFloat(ctxt, (double) ctxt->context->contextSize));
    } else {
	XP_ERROR(XPATH_INVALID_CTXT_SIZE);
    }
}